

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_is_char(asmcode *code,compiler_options *param_2)

{
  operand local_40;
  operand local_3c [3];
  
  local_40 = CL;
  local_3c[2] = 0x39;
  local_3c[1] = 0x17;
  local_3c[0] = local_40;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_3c,&local_40,local_3c + 2,(int *)(local_3c + 1));
  local_3c[0] = XMM12;
  local_40 = AL;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_3c,&local_40);
  local_3c[0] = XMM1;
  local_40 = RAX;
  local_3c[2] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_3c,&local_40,local_3c + 2);
  local_3c[0] = XMM13|CL;
  local_3c[1] = 3;
  local_40 = RAX;
  local_3c[2] = 0x39;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_3c,&local_40,local_3c + 2,(int *)(local_3c + 1));
  local_3c[0] = XMM6;
  local_40 = RAX;
  local_3c[1] = 7;
  local_3c[2] = 0x39;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_3c,&local_40,local_3c + 2,(int *)(local_3c + 1));
  local_3c[0] = BYTE_MEM_RDX;
  local_40 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_3c,&local_40);
  return;
}

Assistant:

void compile_is_char(asmcode& code, const compiler_options&)
  {
  code.add(asmcode::CMP, asmcode::CL, asmcode::NUMBER, char_tag);
  // if comparison (last cmp call) succeeded, then sete puts 1 in al, otherwise 0
  code.add(asmcode::SETE, asmcode::AL);
  // movzx extends the bits in al to the full rax register
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  }